

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl.c
# Opt level: O0

void mcpl_transfer_last_read_particle(mcpl_file_t source,mcpl_outfile_t target)

{
  double dVar1;
  mcpl_outfile_t of;
  int iVar2;
  int iVar3;
  long lVar4;
  long in_RSI;
  mcpl_particle_t *in_RDI;
  uint i;
  float *packekindir_target;
  double *packekindir_src;
  size_t idx_packekindir_src;
  size_t idx_packekindir_target;
  size_t fpsize_target;
  mcpl_fileinternal_t *fs;
  mcpl_outfileinternal_t *ft;
  mcpl_particle_t *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  uint in_stack_ffffffffffffffb4;
  mcpl_outfileinternal_t *in_stack_ffffffffffffffd8;
  
  if ((((in_RDI[1].position[0] != 0.0) ||
       (dVar1 = *(double *)((long)in_RDI[1].position[1] + 0x58), dVar1 != 0.0)) || (NAN(dVar1))) ||
     (*(int *)((long)in_RDI[1].position[1] + 0x60) != 0)) {
    if ((*(int *)(in_RSI + 0x54) == 0) ||
       (*(int *)((long)in_RDI[1].position[1] + 0x60) == *(int *)(in_RSI + 0x54))) {
      if (((*(double *)(in_RSI + 0x58) == 0.0) && (!NAN(*(double *)(in_RSI + 0x58)))) ||
         ((dVar1 = *(double *)((long)in_RDI[1].position[1] + 0x58),
          dVar1 == *(double *)(in_RSI + 0x58) && (!NAN(dVar1) && !NAN(*(double *)(in_RSI + 0x58)))))
         ) {
        if ((*(int *)(in_RDI->polarisation + 2) == 2) ||
           ((*(int *)((long)in_RDI->position + 4) != 0 && (*(int *)(in_RSI + 0x50) == 0)))) {
          of.internal._4_4_ = in_stack_ffffffffffffffb4;
          of.internal._0_4_ = in_stack_ffffffffffffffb0;
          mcpl_add_particle(of,in_stack_ffffffffffffffa8);
        }
        else if (*(int *)(in_RSI + 0x80) == *(int *)(in_RDI[1].position + 2)) {
          if (*(int *)(in_RDI[1].polarisation + 1) != *(int *)(in_RSI + 0x70)) {
            mcpl_error((char *)0x105600);
          }
          memcpy((void *)(in_RSI + 0x84),(void *)((long)in_RDI[1].position + 0x14),
                 (ulong)*(uint *)(in_RDI[1].polarisation + 1));
          mcpl_internal_write_particle_buffer_to_file
                    ((mcpl_outfileinternal_t *)
                     CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
        }
        else {
          mcpl_internal_serialise_particle_to_buffer(in_RDI,in_stack_ffffffffffffffd8);
          lVar4 = 8;
          if (*(int *)(in_RSI + 0x50) != 0) {
            lVar4 = 4;
          }
          iVar2 = 3;
          if (*(int *)(in_RSI + 0x4c) != 0) {
            iVar2 = 6;
          }
          iVar3 = 3;
          if (*(int *)in_RDI->position != 0) {
            iVar3 = 6;
          }
          if (*(int *)((long)in_RDI->position + 4) == *(int *)(in_RSI + 0x50)) {
            memcpy((void *)(in_RSI + 0x84 + iVar2 * lVar4),
                   (void *)((long)in_RDI[1].position + iVar3 * lVar4 + 0x14),lVar4 * 3);
          }
          else if ((*(int *)(in_RSI + 0x50) != 0) && (*(int *)((long)in_RDI->position + 4) == 0)) {
            for (in_stack_ffffffffffffffb4 = 0; in_stack_ffffffffffffffb4 < 3;
                in_stack_ffffffffffffffb4 = in_stack_ffffffffffffffb4 + 1) {
              *(float *)(in_RSI + 0x84 + iVar2 * lVar4 + (ulong)in_stack_ffffffffffffffb4 * 4) =
                   (float)*(double *)
                           ((long)in_RDI[1].position +
                           (ulong)in_stack_ffffffffffffffb4 * 8 + iVar3 * lVar4 + 0x14);
            }
          }
          mcpl_internal_write_particle_buffer_to_file
                    ((mcpl_outfileinternal_t *)
                     CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
        }
      }
      else {
        printf("MCPL ERROR: mcpl_transfer_last_read_particle asked to transfer particle with weight %g into a file with universal weight of %g\n"
               ,*(undefined8 *)((long)in_RDI[1].position[1] + 0x58),*(undefined8 *)(in_RSI + 0x58));
        mcpl_error((char *)0x105589);
      }
    }
    else {
      printf("MCPL ERROR: mcpl_transfer_last_read_particle asked to transfer particle with pdgcode %li into a file with universal pdgcode of %li\n"
             ,(long)*(int *)((long)in_RDI[1].position[1] + 0x60),(long)*(int *)(in_RSI + 0x54));
      mcpl_error((char *)0x105517);
    }
  }
  else {
    mcpl_error((char *)0x1054bb);
  }
  return;
}

Assistant:

void mcpl_transfer_last_read_particle(mcpl_file_t source, mcpl_outfile_t target)
{
  mcpl_outfileinternal_t * ft = (mcpl_outfileinternal_t *)target.internal;
  assert(ft);
  mcpl_fileinternal_t * fs = (mcpl_fileinternal_t *)source.internal;
  assert(fs);

  if ( fs->current_particle_idx==0 && fs->particle->weight==0.0 && fs->particle->pdgcode==0 ) {
    mcpl_error("mcpl_transfer_last_read_particle called with source file in invalid state"
               " (did you forget to first call mcpl_read() on the source file before calling this function?)");
    return;
  }

  //Sanity checks for universal fields here (but not in mcpl_add_particle since users are allowed to create files by setting just the universal fields):
  if ( ft->opt_universalpdgcode && fs->particle->pdgcode != ft->opt_universalpdgcode) {
    printf("MCPL ERROR: mcpl_transfer_last_read_particle asked to transfer particle with pdgcode %li into a file with universal pdgcode of %li\n",
           (long)fs->particle->pdgcode,(long)ft->opt_universalpdgcode);
    mcpl_error("mcpl_transfer_last_read_particle got incompatible pdgcode\n");
    return;
  }
  if ( ft->opt_universalweight && fs->particle->weight != ft->opt_universalweight) {
    printf("MCPL ERROR: mcpl_transfer_last_read_particle asked to transfer particle with weight %g into a file with universal weight of %g\n",
           fs->particle->weight,ft->opt_universalweight);
    mcpl_error("mcpl_transfer_last_read_particle got incompatible weight\n");
    return;
  }
  //NB: We don't sanity check that polarisation/userflags are enabled if present
  //in the input particle, since it is a valid use-case to use this function to
  //discard such info.

  if ( fs->format_version == 2 || ( fs->opt_singleprec && !ft->opt_singleprec ) ) {
    //source file is in old format with different unit vector packing, or the
    //floating point precision is increasing. In these scenarious we can not
    //reuse the 3 floats representing packed direction+ekin but must proceed via
    //a full unpacking+repacking.
    mcpl_add_particle(target,fs->particle);
    return;
  }

  if ( ft->opt_signature == fs->opt_signature ) {
    //Particle data is encoded in exactly the same manner in src and target (a
    //common scenario for many merge or extraction scenarios) -> simply transfer
    //the bytes and be done with it:
    if ( fs->particle_size!=ft->particle_size )
      mcpl_error("unexpectedly inconsistent particle sizes");
    memcpy(ft->particle_buffer,fs->particle_buffer,fs->particle_size);
    mcpl_internal_write_particle_buffer_to_file(ft);
    return;
  }

  //The hard way - first serialise the source particle into the output buffer:
  mcpl_internal_serialise_particle_to_buffer( fs->particle, ft );

  //If possible, override the 3 FP representing packed ekin+dir from the packing
  //in the source, thus avoiding potentially lossy unpacking+packing:
  size_t fpsize_target = ft->opt_singleprec ? sizeof(float) : sizeof(double);
  size_t idx_packekindir_target = (ft->opt_polarisation ? 6 : 3) * fpsize_target;
  size_t idx_packekindir_src = (fs->opt_polarisation ? 6 : 3) * fpsize_target;
  if (fs->opt_singleprec == ft->opt_singleprec) {
    memcpy( &(ft->particle_buffer[idx_packekindir_target]),
            &(fs->particle_buffer[idx_packekindir_src]),
            fpsize_target * 3);
  } else if ( ft->opt_singleprec && !fs->opt_singleprec ) {
    //For the case of double precision -> single precision, we can simply
    //perform a narrowing conversion:
    double * packekindir_src = (double*)&(fs->particle_buffer[idx_packekindir_src]);
    float * packekindir_target = (float*)&(ft->particle_buffer[idx_packekindir_target]);
    for (unsigned i = 0; i < 3; ++i) {
      packekindir_target[i] = (float)packekindir_src[i];
    }
  }

  mcpl_internal_write_particle_buffer_to_file(ft);
}